

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collective.hpp
# Opt level: O0

void mxx::scatterv<std::array<unsigned_int,4ul>>
               (array<unsigned_int,_4UL> *msgs,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *sizes,
               array<unsigned_int,_4UL> *out,size_t recv_size,int root,comm *comm)

{
  undefined4 uVar1;
  size_t sVar2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar3;
  int iVar4;
  size_type sVar5;
  const_iterator cVar6;
  MPI_Datatype poVar7;
  MPI_Comm poVar8;
  const_iterator __last;
  iterator __result;
  reference pvVar9;
  reference pvVar10;
  MPI_Datatype poVar11;
  undefined1 local_f8 [8];
  vector<int,_std::allocator<int>_> displs;
  allocator<int> local_b9;
  undefined1 local_b8 [8];
  vector<int,_std::allocator<int>_> send_counts;
  undefined1 local_98 [4];
  int irecv_size;
  datatype dt;
  undefined1 local_70 [8];
  datatype sizedt;
  ulong local_48;
  size_t send_size;
  comm *comm_local;
  size_t sStack_30;
  int root_local;
  size_t recv_size_local;
  array<unsigned_int,_4UL> *out_local;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *sizes_local;
  array<unsigned_int,_4UL> *msgs_local;
  
  send_size = (size_t)comm;
  comm_local._4_4_ = root;
  sStack_30 = recv_size;
  recv_size_local = (size_t)out;
  out_local = (array<unsigned_int,_4UL> *)sizes;
  sizes_local = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)msgs;
  iVar4 = mxx::comm::rank(comm);
  if (root == iVar4) {
    sVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)out_local);
    iVar4 = mxx::comm::size((comm *)send_size);
    if (sVar5 != (long)iVar4) {
      assert_fail("root != comm.rank() || sizes.size() == static_cast<size_t>(comm.size())",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/include/mxx/collective.hpp"
                  ,0x13f,"scatterv");
    }
  }
  cVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)out_local);
  sizedt._16_8_ =
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)out_local);
  iVar4 = std::
          accumulate<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,int>
                    ((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                      )cVar6._M_current,
                     (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                      )sizedt._16_8_,0);
  local_48 = (ulong)iVar4;
  get_datatype<unsigned_long>();
  poVar7 = datatype::type((datatype *)local_70);
  iVar4 = comm_local._4_4_;
  poVar8 = mxx::comm::operator_cast_to_ompi_communicator_t_((comm *)send_size);
  MPI_Bcast(&local_48,1,poVar7,iVar4,poVar8);
  if (local_48 < 0x7fffffff) {
    get_datatype<std::array<unsigned_int,4ul>>();
    send_counts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._4_4_ = (undefined4)sStack_30;
    iVar4 = mxx::comm::rank((comm *)send_size);
    sVar2 = recv_size_local;
    uVar1 = send_counts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._4_4_;
    if (iVar4 == comm_local._4_4_) {
      iVar4 = mxx::comm::size((comm *)send_size);
      std::allocator<int>::allocator(&local_b9);
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)local_b8,(long)iVar4,&local_b9);
      std::allocator<int>::~allocator(&local_b9);
      cVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)out_local);
      __last = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)out_local);
      __result = std::vector<int,_std::allocator<int>_>::begin
                           ((vector<int,_std::allocator<int>_> *)local_b8);
      displs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage =
           (pointer)std::
                    copy<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                              ((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                )cVar6._M_current,
                               (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                )__last._M_current,
                               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                               __result._M_current);
      impl::get_displacements<int>
                ((vector<int,_std::allocator<int>_> *)local_f8,
                 (vector<int,_std::allocator<int>_> *)local_b8);
      pvVar3 = sizes_local;
      pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_b8,0);
      pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)local_f8,0);
      poVar7 = datatype::type((datatype *)local_98);
      sVar2 = recv_size_local;
      uVar1 = send_counts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage._4_4_;
      poVar11 = datatype::type((datatype *)local_98);
      iVar4 = comm_local._4_4_;
      poVar8 = mxx::comm::operator_cast_to_ompi_communicator_t_((comm *)send_size);
      MPI_Scatterv(pvVar3,pvVar9,pvVar10,poVar7,sVar2,uVar1,poVar11,iVar4,poVar8);
      std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_f8)
      ;
      std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_b8)
      ;
    }
    else {
      poVar7 = datatype::type((datatype *)local_98);
      iVar4 = comm_local._4_4_;
      poVar8 = mxx::comm::operator_cast_to_ompi_communicator_t_((comm *)send_size);
      MPI_Scatterv(0,0,0,&ompi_mpi_datatype_null,sVar2,uVar1,poVar7,iVar4,poVar8);
    }
    datatype::~datatype((datatype *)local_98);
  }
  else {
    impl::scatterv_big<std::array<unsigned_int,4ul>>
              ((array<unsigned_int,_4UL> *)sizes_local,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)out_local,
               (array<unsigned_int,_4UL> *)recv_size_local,sStack_30,comm_local._4_4_,
               (comm *)send_size);
  }
  datatype::~datatype((datatype *)local_70);
  return;
}

Assistant:

void scatterv(const T* msgs, const std::vector<size_t>& sizes, T* out, size_t recv_size, int root, const mxx::comm& comm = mxx::comm()) {
    MXX_ASSERT(root != comm.rank() || sizes.size() == static_cast<size_t>(comm.size()));
    // get total send size
    size_t send_size = std::accumulate(sizes.begin(), sizes.end(), 0);
    mxx::datatype sizedt = mxx::get_datatype<size_t>();
    MPI_Bcast(&send_size, 1, sizedt.type(), root, comm);
    // check if we need to use the custom BIG scatterv
    if (send_size >= mxx::max_int) {
        // own scatter for large messages
        impl::scatterv_big(msgs, sizes, out, recv_size, root, comm);
    } else {
        // regular implementation using integer counts
        mxx::datatype dt = mxx::get_datatype<T>();
        int irecv_size = recv_size;
        if (comm.rank() == root) {
            std::vector<int> send_counts(comm.size());
            std::copy(sizes.begin(), sizes.end(), send_counts.begin());
            std::vector<int> displs = impl::get_displacements(send_counts);
            MPI_Scatterv(const_cast<T*>(msgs), &send_counts[0], &displs[0], dt.type(),
                         out, irecv_size, dt.type(), root, comm);
        } else {
            MPI_Scatterv(NULL, NULL, NULL, MPI_DATATYPE_NULL,
                         out, irecv_size, dt.type(), root, comm);
        }
    }
}